

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatchResultListener * __thiscall
testing::MatchResultListener::operator<<(MatchResultListener *this,char **x)

{
  char **x_local;
  MatchResultListener *this_local;
  
  if (this->stream_ != (ostream *)0x0) {
    std::operator<<(this->stream_,*x);
  }
  return this;
}

Assistant:

MatchResultListener& operator<<(const T& x) {
    if (stream_ != nullptr) *stream_ << x;
    return *this;
  }